

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test<trng::lognormal_dist<float>>(lognormal_dist<float> *d)

{
  bool bVar1;
  undefined1 uVar2;
  Section *catch_internal_Section3;
  Section *catch_internal_Section2;
  Section *catch_internal_Section1;
  Section *catch_internal_Section0;
  SectionInfo *in_stack_fffffffffffffaf0;
  SectionInfo *this;
  undefined7 in_stack_fffffffffffffaf8;
  undefined1 in_stack_fffffffffffffaff;
  SectionInfo *in_stack_fffffffffffffb00;
  SectionInfo *this_00;
  SectionInfo *in_stack_fffffffffffffb28;
  Section *in_stack_fffffffffffffb30;
  SourceLineInfo local_4b0 [3];
  Section *in_stack_fffffffffffffb80;
  lognormal_dist<float> *in_stack_fffffffffffffc30;
  lognormal_dist<float> *in_stack_fffffffffffffc50;
  allocator<char> local_3a1;
  string local_3a0 [16];
  undefined8 in_stack_fffffffffffffc70;
  SourceLineInfo local_380 [11];
  lognormal_dist<float> *in_stack_fffffffffffffd30;
  allocator local_271;
  string local_270 [32];
  SourceLineInfo local_250 [6];
  Section local_1f0;
  Section *local_150;
  allocator local_131;
  string local_130 [32];
  SourceLineInfo local_110 [6];
  Section local_b0;
  Section *local_10;
  
  Catch::SourceLineInfo::SourceLineInfo
            (local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0xd3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"integrate pdf",&local_131);
  Catch::SectionInfo::SectionInfo
            (in_stack_fffffffffffffb00,
             (SourceLineInfo *)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8),
             &in_stack_fffffffffffffaf0->name);
  Catch::Section::Section(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  Catch::SectionInfo::~SectionInfo(in_stack_fffffffffffffaf0);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  local_10 = &local_b0;
  bVar1 = Catch::Section::operator_cast_to_bool(local_10);
  if (bVar1) {
    continuous_dist_test_integrate_pdf<trng::lognormal_dist<float>>(in_stack_fffffffffffffc30);
  }
  Catch::Section::~Section(in_stack_fffffffffffffb80);
  Catch::SourceLineInfo::SourceLineInfo
            (local_250,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0xd6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"icdf",&local_271);
  Catch::SectionInfo::SectionInfo
            (in_stack_fffffffffffffb00,
             (SourceLineInfo *)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8),
             &in_stack_fffffffffffffaf0->name);
  Catch::Section::Section(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  Catch::SectionInfo::~SectionInfo(in_stack_fffffffffffffaf0);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  local_150 = &local_1f0;
  bVar1 = Catch::Section::operator_cast_to_bool(local_150);
  if (bVar1) {
    continuous_dist_test_icdf<trng::lognormal_dist<float>>(in_stack_fffffffffffffc50);
  }
  Catch::Section::~Section(in_stack_fffffffffffffb80);
  Catch::SourceLineInfo::SourceLineInfo
            (local_380,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0xd9);
  this_00 = (SectionInfo *)&local_3a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a0,"chi2 test",(allocator *)this_00);
  Catch::SectionInfo::SectionInfo
            (this_00,(SourceLineInfo *)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8)
             ,&in_stack_fffffffffffffaf0->name);
  Catch::Section::Section(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  Catch::SectionInfo::~SectionInfo(in_stack_fffffffffffffaf0);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  uVar2 = Catch::Section::operator_cast_to_bool((Section *)(local_380 + 6));
  if ((bool)uVar2) {
    continuous_dist_test_chi2_test<trng::lognormal_dist<float>>
              ((lognormal_dist<float> *)in_stack_fffffffffffffc70);
  }
  Catch::Section::~Section(in_stack_fffffffffffffb80);
  Catch::SourceLineInfo::SourceLineInfo
            (local_4b0,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0xdc);
  this = (SectionInfo *)&stack0xfffffffffffffb2f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffb30,"streamable",(allocator *)this);
  Catch::SectionInfo::SectionInfo
            (this_00,(SourceLineInfo *)CONCAT17(uVar2,in_stack_fffffffffffffaf8),&this->name);
  Catch::Section::Section(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  Catch::SectionInfo::~SectionInfo(this);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb30);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb2f);
  bVar1 = Catch::Section::operator_cast_to_bool((Section *)&stack0xfffffffffffffbb0);
  if (bVar1) {
    continuous_dist_test_streamable<trng::lognormal_dist<float>>(in_stack_fffffffffffffd30);
  }
  Catch::Section::~Section(in_stack_fffffffffffffb80);
  return;
}

Assistant:

void continuous_dist_test(T &d) {
  SECTION("integrate pdf") {
    continuous_dist_test_integrate_pdf(d);
  }
  SECTION("icdf") {
    continuous_dist_test_icdf(d);
  }
  SECTION("chi2 test") {
    continuous_dist_test_chi2_test(d);
  }
  SECTION("streamable") {
    continuous_dist_test_streamable(d);
  }
}